

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

void ScaDblWrd(GmfMshSct *msh,void *ptr)

{
  undefined1 uVar1;
  size_t sVar2;
  long lVar3;
  undefined1 *puVar4;
  
  sVar2 = fread(ptr,4,2,(FILE *)msh->hdl);
  if (sVar2 == 2) {
    if (msh->cod != 1) {
      lVar3 = 7;
      puVar4 = (undefined1 *)ptr;
      do {
        uVar1 = *(undefined1 *)((long)ptr + lVar3);
        *(undefined1 *)((long)ptr + lVar3) = *puVar4;
        *puVar4 = uVar1;
        lVar3 = lVar3 + -1;
        puVar4 = puVar4 + 1;
      } while (lVar3 != 3);
    }
    return;
  }
  longjmp((__jmp_buf_tag *)msh->err,-0x1b);
}

Assistant:

static void ScaDblWrd(GmfMshSct *msh, void *ptr)
{
#ifdef WITH_GMF_AIO
   if(read(msh->FilDes, ptr, WrdSiz * 2) != WrdSiz * 2)
#else
   if( fread(ptr, WrdSiz, 2, msh->hdl) != 2 )
#endif
      longjmp(msh->err, -27);

   if(msh->cod != 1)
      SwpWrd((char *)ptr, 2 * WrdSiz);
}